

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O3

int lws_header_table_attach(lws *wsi,int autoservice)

{
  int *piVar1;
  uint uVar2;
  lws_context *plVar3;
  lws_role_ops *plVar4;
  int iVar5;
  long lVar6;
  char *pcVar7;
  lws *plVar8;
  allocated_headers *ptr;
  uint uVar9;
  long lVar10;
  lws_pollargs pa;
  undefined4 uVar11;
  lws_pollargs local_34;
  
  plVar3 = (wsi->a).context;
  lVar6 = (long)wsi->tsi;
  lVar10 = lVar6 * 0x1a0;
  pcVar7 = lws_wsi_tag(wsi);
  uVar11 = *(undefined4 *)((long)plVar3->lcg + lVar10 + -0x78);
  _lws_log(8,"%s: %s: ah %p (tsi %d, count = %d) in\n","lws_header_table_attach",pcVar7,
           (wsi->http).ah,(ulong)(uint)(int)wsi->tsi,uVar11);
  plVar4 = wsi->role_ops;
  if (plVar4 != &role_ops_h2 && plVar4 != &role_ops_h1) {
    _lws_log(1,"%s: bad role %s\n","lws_header_table_attach",plVar4->name);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/woodsts[P]libwebsockets/lib/roles/http/parsers.c"
                  ,0xe1,"int lws_header_table_attach(struct lws *, int)");
  }
  if ((wsi->http).ah == (allocated_headers *)0x0) {
    if (*(uint *)((long)plVar3->lcg + lVar10 + -0x78) != plVar3->max_http_header_pool) {
      __lws_remove_from_ah_waiting_list(wsi);
      uVar2 = plVar3->max_http_header_data;
      ptr = (allocated_headers *)lws_zalloc(0x3d8,"ah struct");
      if (ptr != (allocated_headers *)0x0) {
        pcVar7 = (char *)lws_realloc((void *)0x0,(ulong)uVar2,"ah data");
        ptr->data = pcVar7;
        if (pcVar7 != (char *)0x0) {
          ptr->next = plVar3->pt[lVar6].http.ah_list;
          plVar3->pt[lVar6].http.ah_list = ptr;
          ptr->data_length = uVar2;
          uVar9 = *(int *)((long)plVar3->lcg + lVar10 + -0x7c) + 1;
          *(uint *)((long)plVar3->lcg + lVar10 + -0x7c) = uVar9;
          _lws_log(8,"%s: created ah %p (size %d): pool length %u\n","_lws_create_ah",ptr,
                   (ulong)uVar2,(ulong)uVar9,uVar11);
          (wsi->http).ah = ptr;
          ptr->in_use = '\x01';
          ptr->wsi = wsi;
          piVar1 = (int *)((long)plVar3->lcg + lVar10 + -0x78);
          *piVar1 = *piVar1 + 1;
          _lws_change_pollfd(wsi,0,1,&local_34);
          pcVar7 = lws_wsi_tag(wsi);
          _lws_log(8,"%s: did attach wsi %s: ah %p: count %d (on exit)\n","lws_header_table_attach",
                   pcVar7,(wsi->http).ah,(ulong)*(uint *)((long)plVar3->lcg + lVar10 + -0x78));
          goto LAB_0011bf45;
        }
        lws_realloc(ptr,0,"lws_free");
      }
      (wsi->http).ah = (allocated_headers *)0x0;
    }
    _lws_header_ensure_we_are_on_waiting_list(wsi);
    iVar5 = 1;
  }
  else {
    _lws_log(8,"%s: cleardown\n","lws_header_table_attach");
LAB_0011bf45:
    __lws_header_table_reset(wsi,autoservice);
    if (((wsi->wsistate & 0x1000ffff) == 0x10000200) &&
       (plVar8 = lws_http_client_connect_via_info2(wsi), plVar8 == (lws *)0x0)) {
      return -1;
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int LWS_WARN_UNUSED_RESULT
lws_header_table_attach(struct lws *wsi, int autoservice)
{
	struct lws_context *context = wsi->a.context;
	struct lws_context_per_thread *pt = &context->pt[(int)wsi->tsi];
	struct lws_pollargs pa;
	int n;

#if defined(LWS_ROLE_MQTT) && defined(LWS_WITH_CLIENT)
	if (lwsi_role_mqtt(wsi))
		goto connect_via_info2;
#endif

	lwsl_info("%s: %s: ah %p (tsi %d, count = %d) in\n", __func__,
		  lws_wsi_tag(wsi), (void *)wsi->http.ah, wsi->tsi,
		  pt->http.ah_count_in_use);

	if (!lwsi_role_http(wsi)) {
		lwsl_err("%s: bad role %s\n", __func__, wsi->role_ops->name);
		assert(0);
		return -1;
	}

	lws_pt_lock(pt, __func__);

	/* if we are already bound to one, just clear it down */
	if (wsi->http.ah) {
		lwsl_info("%s: cleardown\n", __func__);
		goto reset;
	}

	n = pt->http.ah_count_in_use == (int)context->max_http_header_pool;
#if defined(LWS_WITH_PEER_LIMITS)
	if (!n)
		n = lws_peer_confirm_ah_attach_ok(context, wsi->peer);
#endif
	if (n) {
		/*
		 * Pool is either all busy, or we don't want to give this
		 * particular guy an ah right now...
		 *
		 * Make sure we are on the waiting list, and return that we
		 * weren't able to provide the ah
		 */
		_lws_header_ensure_we_are_on_waiting_list(wsi);

		goto bail;
	}

	__lws_remove_from_ah_waiting_list(wsi);

	wsi->http.ah = _lws_create_ah(pt, context->max_http_header_data);
	if (!wsi->http.ah) { /* we could not create an ah */
		_lws_header_ensure_we_are_on_waiting_list(wsi);

		goto bail;
	}

	wsi->http.ah->in_use = 1;
	wsi->http.ah->wsi = wsi; /* mark our owner */
	pt->http.ah_count_in_use++;

#if defined(LWS_WITH_PEER_LIMITS) && (defined(LWS_ROLE_H1) || \
    defined(LWS_ROLE_H2))
	lws_context_lock(context, "ah attach"); /* <========================= */
	if (wsi->peer)
		wsi->peer->http.count_ah++;
	lws_context_unlock(context); /* ====================================> */
#endif

	_lws_change_pollfd(wsi, 0, LWS_POLLIN, &pa);

	lwsl_info("%s: did attach wsi %s: ah %p: count %d (on exit)\n", __func__,
		  lws_wsi_tag(wsi), (void *)wsi->http.ah, pt->http.ah_count_in_use);

reset:
	__lws_header_table_reset(wsi, autoservice);

	lws_pt_unlock(pt);

#if defined(LWS_WITH_CLIENT)
#if defined(LWS_ROLE_MQTT)
connect_via_info2:
#endif
	if (lwsi_role_client(wsi) && lwsi_state(wsi) == LRS_UNCONNECTED)
		if (!lws_http_client_connect_via_info2(wsi))
			/* our client connect has failed, the wsi
			 * has been closed
			 */
			return -1;
#endif

	return 0;

bail:
	lws_pt_unlock(pt);

	return 1;
}